

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  int iVar2;
  ImGuiPopupData *pIVar3;
  int i;
  int m;
  int i_00;
  ImVector<ImGuiPopupData> *this;
  bool bVar4;
  
  iVar2 = (GImGui->OpenPopupStack).Size;
  if (iVar2 != 0) {
    if (ref_window == (ImGuiWindow *)0x0) {
      i = 0;
    }
    else {
      this = &GImGui->OpenPopupStack;
      for (i = 0; i < iVar2; i = i + 1) {
        pIVar3 = ImVector<ImGuiPopupData>::operator[](this,i);
        if (pIVar3->Window != (ImGuiWindow *)0x0) {
          uVar1 = pIVar3->Window->Flags;
          if ((uVar1 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                          ,0x1db4,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          if ((uVar1 >> 0x18 & 1) == 0) {
            bVar4 = false;
            i_00 = i;
            while ((iVar2 = this->Size, i_00 < iVar2 && (!bVar4))) {
              pIVar3 = ImVector<ImGuiPopupData>::operator[](this,i_00);
              if (pIVar3->Window == (ImGuiWindow *)0x0) {
                bVar4 = false;
              }
              else {
                bVar4 = pIVar3->Window->RootWindow == ref_window->RootWindow;
              }
              i_00 = i_00 + 1;
            }
            if (!bVar4) break;
          }
        }
        iVar2 = this->Size;
      }
    }
    if (i < iVar2) {
      ClosePopupToLevel(i,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack when popups are not direct descendant of the reference window (the reference window is often the NavWindow)
            bool popup_or_descendent_is_ref_window = false;
            for (int m = popup_count_to_keep; m < g.OpenPopupStack.Size && !popup_or_descendent_is_ref_window; m++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[m].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                        popup_or_descendent_is_ref_window = true;
            if (!popup_or_descendent_is_ref_window)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        //IMGUI_DEBUG_LOG("ClosePopupsOverWindow(%s) -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}